

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall
USDFParser::ParseCostRequireExclude(USDFParser *this,FStrifeDialogueReply *response,FName *type)

{
  bool bVar1;
  int iVar2;
  PClassActor *p;
  char *pcVar3;
  undefined1 local_34 [8];
  FName key;
  FStrifeDialogueItemCheck check;
  FName *type_local;
  FStrifeDialogueReply *response_local;
  USDFParser *this_local;
  
  stack0xffffffffffffffd0 = (PClassInventory *)0x0;
  while (bVar1 = FScanner::CheckToken((FScanner *)this,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    UDMFParserBase::ParseKey((UDMFParserBase *)local_34,SUB81(this,0),(bool *)0x0);
    iVar2 = FName::operator_cast_to_int((FName *)local_34);
    if (iVar2 == 0x29) {
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      p = CheckActorType(this,pcVar3);
      register0x00000000 = dyn_cast<PClassInventory>((DObject *)p);
    }
    else if (iVar2 == 0x1de) {
      pcVar3 = FName::operator_cast_to_char_((FName *)local_34);
      UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
    }
  }
  iVar2 = FName::operator_cast_to_int(type);
  if (iVar2 == 0x1e7) {
    TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push
              (&response->ItemCheck,(FStrifeDialogueItemCheck *)(local_34 + 4));
  }
  else if (iVar2 == 0x1f1) {
    TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push
              (&response->ItemCheckRequire,(FStrifeDialogueItemCheck *)(local_34 + 4));
  }
  else if (iVar2 == 0x1f2) {
    TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push
              (&response->ItemCheckExclude,(FStrifeDialogueItemCheck *)(local_34 + 4));
  }
  return true;
}

Assistant:

bool ParseCostRequireExclude(FStrifeDialogueReply *response, FName type)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Amount:
				check.Amount = CheckInt(key);
				break;
			}
		}

		switch (type)
		{
		case NAME_Cost:		response->ItemCheck.Push(check);	break;
		case NAME_Require:	response->ItemCheckRequire.Push(check); break;
		case NAME_Exclude:	response->ItemCheckExclude.Push(check); break;
		}
		return true;
	}